

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CallbackFederate.cpp
# Opt level: O1

void __thiscall
helics::CallbackFederate::CallbackFederate(CallbackFederate *this,CallbackFederate *param_1)

{
  undefined8 uVar1;
  undefined8 uVar2;
  
  Federate::Federate((Federate *)&(this->super_CombinationFederate).super_ValueFederate.field_0x98,
                     (Federate *)
                     ((long)&(param_1->super_CombinationFederate).super_ValueFederate.
                             _vptr_ValueFederate +
                     (long)(param_1->super_CombinationFederate).super_ValueFederate.
                           _vptr_ValueFederate[-3]));
  helics::CombinationFederate::CombinationFederate
            (&this->super_CombinationFederate,&PTR_construction_vtable_24__00558ab8,
             &param_1->super_CombinationFederate);
  (this->super_CombinationFederate).super_ValueFederate._vptr_ValueFederate = (_func_int **)0x558908
  ;
  *(undefined8 *)&(this->super_CombinationFederate).super_ValueFederate.field_0x98 = 0x558a30;
  *(undefined8 *)&(this->super_CombinationFederate).super_ValueFederate.field_0x10 = 0x558968;
  *(undefined8 *)&(this->super_CombinationFederate).super_ValueFederate.field_0x28 = 0;
  uVar1 = *(undefined8 *)&(param_1->super_CombinationFederate).super_ValueFederate.field_0x20;
  uVar2 = *(undefined8 *)&(param_1->super_CombinationFederate).super_ValueFederate.field_0x28;
  *(undefined8 *)&(param_1->super_CombinationFederate).super_ValueFederate.field_0x28 = 0;
  *(undefined8 *)&(this->super_CombinationFederate).super_ValueFederate.field_0x20 = uVar1;
  *(undefined8 *)&(this->super_CombinationFederate).super_ValueFederate.field_0x28 = uVar2;
  *(undefined8 *)&(param_1->super_CombinationFederate).super_ValueFederate.field_0x20 = 0;
  (this->super_CombinationFederate).super_ValueFederate.field_0x30 =
       (param_1->super_CombinationFederate).super_ValueFederate.field_0x30;
  *(undefined8 *)&(this->super_CombinationFederate).super_ValueFederate.field_0x38 = 0;
  *(undefined8 *)&(this->super_CombinationFederate).super_ValueFederate.field_0x40 = 0;
  *(undefined8 *)&(this->super_CombinationFederate).super_ValueFederate.field_0x48 = 0;
  *(undefined8 *)&(this->super_CombinationFederate).super_ValueFederate.field_0x50 =
       *(undefined8 *)&(param_1->super_CombinationFederate).super_ValueFederate.field_0x50;
  if (*(long *)&(param_1->super_CombinationFederate).super_ValueFederate.field_0x48 != 0) {
    uVar1 = *(undefined8 *)&(param_1->super_CombinationFederate).super_ValueFederate.field_0x40;
    *(undefined8 *)&(this->super_CombinationFederate).super_ValueFederate.field_0x38 =
         *(undefined8 *)&(param_1->super_CombinationFederate).super_ValueFederate.field_0x38;
    *(undefined8 *)&(this->super_CombinationFederate).super_ValueFederate.field_0x40 = uVar1;
    *(undefined8 *)&(this->super_CombinationFederate).super_ValueFederate.field_0x48 =
         *(undefined8 *)&(param_1->super_CombinationFederate).super_ValueFederate.field_0x48;
    *(undefined8 *)&(param_1->super_CombinationFederate).super_ValueFederate.field_0x48 = 0;
    *(undefined8 *)&(param_1->super_CombinationFederate).super_ValueFederate.field_0x50 = 0;
  }
  *(undefined8 *)&(this->super_CombinationFederate).super_ValueFederate.field_0x58 = 0;
  *(undefined8 *)&(this->super_CombinationFederate).super_ValueFederate.field_0x60 = 0;
  *(undefined8 *)&(this->super_CombinationFederate).super_ValueFederate.field_0x68 = 0;
  *(undefined8 *)&(this->super_CombinationFederate).super_ValueFederate.field_0x70 =
       *(undefined8 *)&(param_1->super_CombinationFederate).super_ValueFederate.field_0x70;
  if (*(long *)&(param_1->super_CombinationFederate).super_ValueFederate.field_0x68 != 0) {
    uVar1 = *(undefined8 *)&(param_1->super_CombinationFederate).super_ValueFederate.field_0x60;
    *(undefined8 *)&(this->super_CombinationFederate).super_ValueFederate.field_0x58 =
         *(undefined8 *)&(param_1->super_CombinationFederate).super_ValueFederate.field_0x58;
    *(undefined8 *)&(this->super_CombinationFederate).super_ValueFederate.field_0x60 = uVar1;
    *(undefined8 *)&(this->super_CombinationFederate).super_ValueFederate.field_0x68 =
         *(undefined8 *)&(param_1->super_CombinationFederate).super_ValueFederate.field_0x68;
    *(undefined8 *)&(param_1->super_CombinationFederate).super_ValueFederate.field_0x68 = 0;
    *(undefined8 *)&(param_1->super_CombinationFederate).super_ValueFederate.field_0x70 = 0;
  }
  *(undefined8 *)&(this->super_CombinationFederate).super_ValueFederate.field_0x78 = 0;
  *(undefined8 *)&(this->super_CombinationFederate).super_ValueFederate.field_0x80 = 0;
  *(undefined8 *)&(this->super_CombinationFederate).super_ValueFederate.field_0x88 = 0;
  *(undefined8 *)&(this->super_CombinationFederate).super_ValueFederate.field_0x90 =
       *(undefined8 *)&(param_1->super_CombinationFederate).super_ValueFederate.field_0x90;
  if (*(long *)&(param_1->super_CombinationFederate).super_ValueFederate.field_0x88 != 0) {
    uVar1 = *(undefined8 *)&(param_1->super_CombinationFederate).super_ValueFederate.field_0x80;
    *(undefined8 *)&(this->super_CombinationFederate).super_ValueFederate.field_0x78 =
         *(undefined8 *)&(param_1->super_CombinationFederate).super_ValueFederate.field_0x78;
    *(undefined8 *)&(this->super_CombinationFederate).super_ValueFederate.field_0x80 = uVar1;
    *(undefined8 *)&(this->super_CombinationFederate).super_ValueFederate.field_0x88 =
         *(undefined8 *)&(param_1->super_CombinationFederate).super_ValueFederate.field_0x88;
    *(undefined8 *)&(param_1->super_CombinationFederate).super_ValueFederate.field_0x88 = 0;
    *(undefined8 *)&(param_1->super_CombinationFederate).super_ValueFederate.field_0x90 = 0;
  }
  return;
}

Assistant:

CallbackFederate::CallbackFederate(CallbackFederate&&) noexcept = default;